

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Cluster::WriteClusterHeader(Cluster *this)

{
  int32 iVar1;
  int iVar2;
  undefined4 extraout_var;
  uint64 size;
  Cluster *in_RDI;
  IMkvWriter *fixed_size;
  Cluster *type;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  if ((in_RDI->finalized_ & 1U) == 0) {
    type = in_RDI;
    iVar1 = WriteID((IMkvWriter *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                    (uint64)in_RDI);
    if (iVar1 == 0) {
      iVar2 = (*in_RDI->writer_->_vptr_IMkvWriter[1])();
      in_RDI->size_position_ = CONCAT44(extraout_var,iVar2);
      iVar1 = SerializeInt((IMkvWriter *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(int64)type
                           ,(int32)((ulong)in_RDI >> 0x20));
      if (iVar1 == 0) {
        fixed_size = in_RDI->writer_;
        timecode(in_RDI);
        bVar3 = WriteEbmlElement((IMkvWriter *)
                                 CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                 (uint64)type,(uint64)in_RDI,(uint64)fixed_size);
        if (bVar3) {
          timecode(in_RDI);
          size = EbmlElementSize((uint64)type,(uint64)in_RDI,(uint64)fixed_size);
          AddPayloadSize(in_RDI,size);
          in_RDI->header_written_ = true;
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
      }
      else {
        bVar3 = false;
      }
    }
    else {
      bVar3 = false;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Cluster::WriteClusterHeader() {
  if (finalized_)
    return false;

  if (WriteID(writer_, libwebm::kMkvCluster))
    return false;

  // Save for later.
  size_position_ = writer_->Position();

  // Write "unknown" (EBML coded -1) as cluster size value. We need to write 8
  // bytes because we do not know how big our cluster will be.
  if (SerializeInt(writer_, kEbmlUnknownValue, 8))
    return false;

  if (!WriteEbmlElement(writer_, libwebm::kMkvTimecode, timecode(),
                        fixed_size_timecode_ ? 8 : 0)) {
    return false;
  }
  AddPayloadSize(EbmlElementSize(libwebm::kMkvTimecode, timecode(),
                                 fixed_size_timecode_ ? 8 : 0));
  header_written_ = true;

  return true;
}